

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::clearSolvingData(Statistics *this)

{
  (*this->solvingTime->_vptr_Timer[2])();
  (*this->preprocessingTime->_vptr_Timer[2])();
  (*this->simplexTime->_vptr_Timer[2])();
  (*this->syncTime->_vptr_Timer[2])();
  (*this->transformTime->_vptr_Timer[2])();
  (*this->rationalTime->_vptr_Timer[2])();
  (*this->initialPrecisionTime->_vptr_Timer[2])();
  (*this->extendedPrecisionTime->_vptr_Timer[2])();
  (*this->reconstructionTime->_vptr_Timer[2])();
  (*this->boostingStepTime->_vptr_Timer[2])();
  memset(&this->multTimeSparse,0,0xe4);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->sumDualDegen).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->sumPrimalDegen).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->totalBoundViol).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->totalRowViol).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->maxBoundViol).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->maxRowViol).m_backend,0);
  this->redProbStatus = 0;
  this->compProbStatus = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->finalCompObj).m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->finalBasisCondition).m_backend,0);
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::clearSolvingData()
{
   solvingTime->reset();
   preprocessingTime->reset();
   simplexTime->reset();
   syncTime->reset();
   transformTime->reset();
   rationalTime->reset();
   initialPrecisionTime->reset();
   extendedPrecisionTime->reset();
   reconstructionTime->reset();
   boostingStepTime->reset();
   multTimeSparse = 0.0;
   multTimeFull = 0.0;
   multTimeColwise = 0.0;
   multTimeUnsetup = 0.0;
   multSparseCalls = 0;
   multFullCalls = 0;
   multColwiseCalls = 0;
   multUnsetupCalls = 0;
   luFactorizationTimeReal = 0.0;
   luSolveTimeReal = 0.0;
   luFactorizationTimeRational = 0.0;
   luSolveTimeRational = 0.0;
   fpTime = 0.0;
   iterations = 0;
   iterationsPrimal = 0;
   iterationsFromBasis = 0;
   iterationsPolish = 0;
   iterationsFP = 0;
   boundflips = 0;
   boostedIterations = 0;
   boostedIterationsPrimal = 0;
   boostedIterationsFromBasis = 0;
   boostedIterationsPolish = 0;
   boostedBoundflips = 0;
   luFactorizationsReal = 0;
   luSolvesReal = 0;
   luFactorizationsRational = 0;
   rationalReconstructions = 0;
   refinements = 0;
   stallRefinements = 0;
   pivotRefinements = 0;
   feasRefinements = 0;
   unbdRefinements = 0;
   precBoosts = 0;
   stallPrecBoosts = 0;
   pivotPrecBoosts = 0;
   feasPrecBoosts = 0;
   unbdPrecBoosts = 0;

   callsReducedProb = 0;
   iterationsInit = 0;
   iterationsRedProb = 0;
   iterationsCompProb = 0;
   numRedProbRows = 0;
   numRedProbCols = 0;
   degenPivotsPrimal = 0;
   degenPivotsDual = 0;
   degenPivotCandPrimal = 0;
   degenPivotCandDual = 0;
   sumDualDegen = 0;
   sumPrimalDegen = 0;
   totalBoundViol = 0;
   totalRowViol = 0;
   maxBoundViol = 0;
   maxRowViol = 0;
   redProbStatus = 0;
   compProbStatus = 0;
   finalCompObj = 0;
   finalBasisCondition = 0;
}